

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  short sVar1;
  DbFixer *pDVar2;
  Parse *pPVar3;
  Parse *pPVar4;
  AggInfo *pAVar5;
  ExprList *pEVar6;
  Expr *pEVar7;
  u8 uVar8;
  AggInfo_col *pAVar9;
  AggInfo_func *pAVar10;
  FuncDef *pFVar11;
  Table **ppTVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  ExprList_item *pEVar16;
  int iVar17;
  int *in_R8;
  int *piVar18;
  int iVar19;
  i16 *piVar20;
  bool bVar21;
  int i;
  int i_1;
  
  pDVar2 = (pWalker->u).pFix;
  pPVar3 = pDVar2->pParse;
  pPVar4 = (pDVar2->w).pParse;
  pAVar5 = (AggInfo *)(pDVar2->w).xExprCallback;
  uVar8 = pExpr->op;
  if (uVar8 != 0xa7) {
    if (uVar8 == 0xa8) {
      if (((pDVar2->w).walkerDepth & 0x20000) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      pAVar10 = pAVar5->aFunc;
      piVar18 = &pAVar5->nFunc;
      uVar15 = 0;
      iVar14 = -1;
      while( true ) {
        iVar19 = *piVar18;
        iVar17 = (int)uVar15;
        if ((iVar19 <= iVar17) || (pAVar10->pFExpr == pExpr)) goto LAB_001b0fef;
        iVar19 = sqlite3ExprCompare((Parse *)0x0,pAVar10->pFExpr,pExpr,-1);
        if (iVar19 == 0) break;
        uVar15 = (ulong)(iVar17 + 1);
        pAVar10 = pAVar10 + 1;
      }
      iVar19 = *piVar18;
LAB_001b0fef:
      if (iVar19 <= iVar17) {
        uVar8 = pPVar3->db->enc;
        pAVar10 = (AggInfo_func *)
                  sqlite3ArrayAllocate(pPVar3->db,pAVar5->aFunc,(int)piVar18,&i_1,in_R8);
        pAVar5->aFunc = pAVar10;
        uVar15 = (ulong)i_1;
        if (-1 < (long)uVar15) {
          pAVar10[uVar15].pFExpr = pExpr;
          iVar19 = pPVar3->nMem + 1;
          pPVar3->nMem = iVar19;
          pAVar10[uVar15].iMem = iVar19;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            iVar19 = 0;
          }
          else {
            iVar19 = ((pExpr->x).pList)->nExpr;
          }
          pFVar11 = sqlite3FindFunction(pPVar3->db,(pExpr->u).zToken,iVar19,uVar8,'\0');
          pAVar10[uVar15].pFunc = pFVar11;
          if ((pExpr->flags & 4) != 0) {
            iVar14 = pPVar3->nTab;
            pPVar3->nTab = iVar14 + 1;
          }
          pAVar10[uVar15].iDistinct = iVar14;
        }
      }
      pExpr->iAgg = (i16)uVar15;
      pExpr->pAggInfo = pAVar5;
      return 1;
    }
    if ((uVar8 != 0xb3) && (uVar8 != 0xa9)) {
      return 0;
    }
  }
  if (pPVar4 != (Parse *)0x0) {
    iVar14 = 0;
    if (0 < *(int *)&pPVar4->db) {
      iVar14 = *(int *)&pPVar4->db;
    }
    ppTVar12 = (Table **)&pPVar4->nLabelAlloc;
    while (bVar21 = iVar14 != 0, iVar14 = iVar14 + -1, bVar21) {
      if (pExpr->iTable == *(int *)ppTVar12) {
        piVar13 = (int *)0x0;
        piVar18 = (int *)(ulong)(uint)pAVar5->nColumn;
        if (pAVar5->nColumn < 1) {
          piVar18 = piVar13;
        }
        piVar20 = &pAVar5->aCol->iColumn;
        goto LAB_001b0ef6;
      }
      ppTVar12 = ppTVar12 + 0xd;
    }
  }
  return 1;
LAB_001b0ef6:
  if ((int)piVar18 == (int)piVar13) goto LAB_001b0f25;
  if ((*(int *)(piVar20 + -4) == pExpr->iTable) && (*piVar20 == pExpr->iColumn && uVar8 != 0xb3))
  goto LAB_001b0f9f;
  piVar13 = (int *)(ulong)((int)piVar13 + 1);
  piVar20 = piVar20 + 0x10;
  goto LAB_001b0ef6;
LAB_001b0f25:
  pAVar9 = (AggInfo_col *)
           sqlite3ArrayAllocate(pPVar3->db,pAVar5->aCol,(int)pAVar5 + 0x28,&i,piVar18);
  pAVar5->aCol = pAVar9;
  piVar13 = (int *)(long)i;
  if (-1 < (long)piVar13) {
    *(anon_union_8_3_c79b3df9_for_y *)(pAVar9 + (long)piVar13) = pExpr->y;
    iVar14 = pExpr->iTable;
    pAVar9[(long)piVar13].iTable = iVar14;
    sVar1 = pExpr->iColumn;
    pAVar9[(long)piVar13].iColumn = sVar1;
    iVar19 = pPVar3->nMem + 1;
    pPVar3->nMem = iVar19;
    pAVar9[(long)piVar13].iMem = iVar19;
    pAVar9[(long)piVar13].pCExpr = pExpr;
    pEVar6 = pAVar5->pGroupBy;
    if ((pEVar6 != (ExprList *)0x0) && (pExpr->op != 0xb3)) {
      iVar19 = pEVar6->nExpr;
      pEVar16 = pEVar6->a;
      iVar17 = 0;
      if (iVar19 < 1) {
        iVar19 = 0;
        iVar17 = 0;
      }
      for (; iVar19 != iVar17; iVar17 = iVar17 + 1) {
        pEVar7 = pEVar16->pExpr;
        if (((pEVar7->op == 0xa7) && (pEVar7->iTable == iVar14)) && (pEVar7->iColumn == sVar1)) {
          pAVar9[(long)piVar13].iSorterColumn = (short)iVar17;
          if (-1 < (short)iVar17) goto LAB_001b0f9d;
          break;
        }
        pEVar16 = pEVar16 + 1;
      }
    }
    iVar14 = pAVar5->nSortingColumn;
    pAVar5->nSortingColumn = iVar14 + 1;
    pAVar9[(long)piVar13].iSorterColumn = (i16)iVar14;
  }
LAB_001b0f9d:
  uVar8 = pExpr->op;
LAB_001b0f9f:
  pExpr->pAggInfo = pAVar5;
  if (uVar8 == 0xa7) {
    pExpr->op = 0xa9;
  }
  pExpr->iAgg = (i16)piVar13;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable
               && pCol->iColumn==pExpr->iColumn
               && pExpr->op!=TK_IF_NULL_ROW
              ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0
            ){
              pCol = &pAggInfo->aCol[k];
              assert( ExprUseYTab(pExpr) );
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pCExpr = pExpr;
              if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN
                   && pE->iTable==pExpr->iTable
                   && pE->iColumn==pExpr->iColumn
                  ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            if( pExpr->op==TK_COLUMN ){
              pExpr->op = TK_AGG_COLUMN;
            }
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( pItem->pFExpr==pExpr ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( ExprUseUToken(pExpr) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken,
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}